

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O0

void __thiscall CServerBrowser::AddFavorite(CServerBrowser *this,CServerInfo *pInfo)

{
  bool bVar1;
  CServerEntry *pCVar2;
  char *in_RSI;
  CServerBrowser *in_RDI;
  CServerBrowserFilter *unaff_retaddr;
  CServerEntry *pEntry;
  CServerBrowserFavorites *in_stack_00000010;
  int i;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  CServerBrowser *this_00;
  
  this_00 = in_RDI;
  bVar1 = CServerBrowserFavorites::AddFavoriteEx
                    (in_stack_00000010,(char *)pEntry,(NETADDR *)unaff_retaddr,
                     SUB81((ulong)in_RDI >> 0x38,0),in_RSI);
  if (bVar1) {
    for (iVar3 = 0; iVar3 < 2; iVar3 = iVar3 + 1) {
      pCVar2 = Find(this_00,(int)((ulong)in_RSI >> 0x20),
                    (NETADDR *)CONCAT44(iVar3,in_stack_ffffffffffffffe8));
      if ((pCVar2 != (CServerEntry *)0x0) &&
         ((pCVar2->m_Info).m_Favorite = true, iVar3 == in_RDI->m_ActServerlistType)) {
        CServerBrowserFilter::Sort
                  (unaff_retaddr,(CServerEntry **)this_00,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
      }
    }
  }
  return;
}

Assistant:

void CServerBrowser::AddFavorite(const CServerInfo *pInfo)
{
	if(m_ServerBrowserFavorites.AddFavoriteEx(pInfo->m_aHostname, &pInfo->m_NetAddr, true))
	{
		for(int i = 0; i < NUM_TYPES; ++i)
		{
			CServerEntry *pEntry = Find(i, pInfo->m_NetAddr);
			if(pEntry)
			{
				pEntry->m_Info.m_Favorite = true;

				// refresh servers in all filters where favorites are filtered
				if(i == m_ActServerlistType)
					m_ServerBrowserFilter.Sort(m_aServerlist[m_ActServerlistType].m_ppServerlist, m_aServerlist[m_ActServerlistType].m_NumServers, CServerBrowserFilter::RESORT_FLAG_FAV);
			}
		}
	}
}